

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O1

void __thiscall
duckdb::UncompressedCompressState::FlushSegment(UncompressedCompressState *this,idx_t segment_size)

{
  _func_int **pp_Var1;
  _Head_base<0UL,_duckdb::CompressionAppendState_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var3;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> _Var4;
  ColumnCheckpointState *pCVar5;
  pointer pCVar6;
  pointer pOVar7;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_30;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_28;
  
  pCVar5 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  if ((pCVar6->type).physical_type_ == VARCHAR) {
    pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    local_28._M_head_impl =
         (pCVar6->segment_state).
         super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
         .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
    optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
              ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_28);
    _Var4._M_head_impl = local_28._M_head_impl;
    pOVar7 = unique_ptr<duckdb::OverflowStringWriter,_std::default_delete<duckdb::OverflowStringWriter>,_true>
             ::operator->((unique_ptr<duckdb::OverflowStringWriter,_std::default_delete<duckdb::OverflowStringWriter>,_true>
                           *)(local_28._M_head_impl + 9));
    (*pOVar7->_vptr_OverflowStringWriter[3])(pOVar7);
    pp_Var1 = _Var4._M_head_impl[9]._vptr_CompressedSegmentState;
    _Var4._M_head_impl[9]._vptr_CompressedSegmentState = (_func_int **)0x0;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
    }
  }
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::
  _M_erase_at_end(&(this->append_state).child_appends.
                   super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>
                  ,(this->append_state).child_appends.
                   super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>
                   .
                   super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  _Var2._M_head_impl =
       (this->append_state).append_state.
       super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
       .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl;
  (this->append_state).append_state.
  super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
  .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
       (CompressionAppendState *)0x0;
  if (_Var2._M_head_impl != (CompressionAppendState *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_CompressionAppendState + 8))();
  }
  ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
        &(this->append_state).lock,(pointer)0x0);
  local_30._M_head_impl =
       (this->current_segment).
       super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
       super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  (*pCVar5->_vptr_ColumnCheckpointState[3])(pCVar5,&local_30,segment_size);
  _Var3._M_head_impl = local_30._M_head_impl;
  if (local_30._M_head_impl != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_30._M_head_impl);
    operator_delete(_Var3._M_head_impl);
  }
  return;
}

Assistant:

void UncompressedCompressState::FlushSegment(idx_t segment_size) {
	auto &state = checkpoint_data.GetCheckpointState();
	if (current_segment->type.InternalType() == PhysicalType::VARCHAR) {
		auto &segment_state = current_segment->GetSegmentState()->Cast<UncompressedStringSegmentState>();
		segment_state.overflow_writer->Flush();
		segment_state.overflow_writer.reset();
	}
	append_state.child_appends.clear();
	append_state.append_state.reset();
	append_state.lock.reset();
	state.FlushSegmentInternal(std::move(current_segment), segment_size);
}